

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int freeSpace(MemPage *pPage,u16 iStart,u16 iSize)

{
  byte bVar1;
  char cVar2;
  long lVar3;
  undefined1 uVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  undefined1 *puVar8;
  ushort in_DX;
  ushort in_SI;
  long in_RDI;
  int iPtrEnd;
  u8 *pTmp;
  uchar *data;
  u32 iEnd;
  u16 x;
  u16 iOrigSize;
  u8 nFrag;
  u8 hdr;
  u16 iFreeBlk;
  u16 iPtr;
  uint local_24;
  byte local_1a;
  ushort local_18;
  ushort local_16;
  ushort local_14;
  ushort local_12;
  
  local_1a = 0;
  local_24 = (uint)in_SI + (uint)in_DX;
  lVar3 = *(long *)(in_RDI + 0x50);
  bVar1 = *(byte *)(in_RDI + 9);
  local_16 = bVar1 + 1;
  uVar5 = local_16;
  local_14 = in_DX;
  local_12 = in_SI;
  if ((*(char *)(lVar3 + (int)(local_16 + 1)) == '\0') &&
     (*(char *)(lVar3 + (ulong)local_16) == '\0')) {
    local_18 = 0;
  }
  else {
    do {
      local_16 = uVar5;
      cVar2 = *(char *)(lVar3 + 1 + (ulong)local_16);
      local_18 = CONCAT11(*(undefined1 *)(lVar3 + (ulong)local_16),cVar2);
      if (in_SI <= CONCAT11(*(undefined1 *)(lVar3 + (ulong)local_16),cVar2)) goto LAB_001935ce;
      uVar5 = local_18;
    } while (local_16 < local_18);
    if (local_18 != 0) {
      iVar7 = sqlite3CorruptError(0);
      return iVar7;
    }
LAB_001935ce:
    if (*(int *)(*(long *)(in_RDI + 0x48) + 0x38) - 4U < (uint)local_18) {
      iVar7 = sqlite3CorruptError(0);
      return iVar7;
    }
    if ((local_18 != 0) && ((uint)local_18 <= local_24 + 3)) {
      local_1a = cVar2 - (char)local_24;
      if (local_18 < local_24) {
        iVar7 = sqlite3CorruptError(0);
        return iVar7;
      }
      local_24 = (uint)local_18 +
                 (uint)CONCAT11(*(undefined1 *)(lVar3 + (int)(local_18 + 2)),
                                *(undefined1 *)(lVar3 + 1 + (long)(int)(local_18 + 2)));
      if (*(uint *)(*(long *)(in_RDI + 0x48) + 0x38) < local_24) {
        iVar7 = sqlite3CorruptError(0);
        return iVar7;
      }
      local_14 = (short)local_24 - in_SI;
      local_18 = CONCAT11(*(undefined1 *)(lVar3 + (ulong)local_18),
                          *(undefined1 *)(lVar3 + 1 + (ulong)local_18));
    }
    if (((ushort)(bVar1 + 1) < local_16) &&
       (uVar6 = (uint)local_16 +
                (uint)CONCAT11(*(undefined1 *)(lVar3 + (int)(local_16 + 2)),
                               *(undefined1 *)(lVar3 + 1 + (long)(int)(local_16 + 2))),
       (uint)in_SI <= uVar6 + 3)) {
      if (in_SI < uVar6) {
        iVar7 = sqlite3CorruptError(0);
        return iVar7;
      }
      local_1a = local_1a + ((char)in_SI - (char)uVar6);
      local_14 = (short)local_24 - local_16;
      local_12 = local_16;
    }
    if (*(byte *)(lVar3 + (int)(bVar1 + 7)) < local_1a) {
      iVar7 = sqlite3CorruptError(0);
      return iVar7;
    }
    *(byte *)(lVar3 + (int)(bVar1 + 7)) = *(char *)(lVar3 + (int)(bVar1 + 7)) - local_1a;
  }
  puVar8 = (undefined1 *)(lVar3 + (int)(bVar1 + 5));
  uVar5 = CONCAT11(*puVar8,puVar8[1]);
  if ((*(ushort *)(*(long *)(in_RDI + 0x48) + 0x28) & 0xc) != 0) {
    memset((void *)(lVar3 + (ulong)local_12),0,(ulong)local_14);
  }
  uVar4 = (undefined1)(local_18 >> 8);
  if (uVar5 < local_12) {
    *(char *)(lVar3 + (ulong)local_16) = (char)(local_12 >> 8);
    *(char *)(lVar3 + 1 + (ulong)local_16) = (char)local_12;
    *(undefined1 *)(lVar3 + (ulong)local_12) = uVar4;
    *(char *)(lVar3 + 1 + (ulong)local_12) = (char)local_18;
    *(char *)(lVar3 + (int)(local_12 + 2)) = (char)(local_14 >> 8);
    *(char *)(lVar3 + 1 + (long)(int)(local_12 + 2)) = (char)local_14;
  }
  else {
    if (local_12 < uVar5) {
      iVar7 = sqlite3CorruptError(0);
      return iVar7;
    }
    if (local_16 != (ushort)(bVar1 + 1)) {
      iVar7 = sqlite3CorruptError(0);
      return iVar7;
    }
    *(undefined1 *)(lVar3 + (int)(bVar1 + 1)) = uVar4;
    *(char *)(lVar3 + 1 + (long)(int)(bVar1 + 1)) = (char)local_18;
    *(char *)(lVar3 + (int)(bVar1 + 5)) = (char)(local_24 >> 8);
    *(char *)(lVar3 + 1 + (long)(int)(bVar1 + 5)) = (char)local_24;
  }
  *(uint *)(in_RDI + 0x14) = (uint)in_DX + *(int *)(in_RDI + 0x14);
  return 0;
}

Assistant:

static int freeSpace(MemPage *pPage, u16 iStart, u16 iSize){
  u16 iPtr;                             /* Address of ptr to next freeblock */
  u16 iFreeBlk;                         /* Address of the next freeblock */
  u8 hdr;                               /* Page header size.  0 or 100 */
  u8 nFrag = 0;                         /* Reduction in fragmentation */
  u16 iOrigSize = iSize;                /* Original value of iSize */
  u16 x;                                /* Offset to cell content area */
  u32 iEnd = iStart + iSize;            /* First byte past the iStart buffer */
  unsigned char *data = pPage->aData;   /* Page content */
  u8 *pTmp;                             /* Temporary ptr into data[] */

  assert( pPage->pBt!=0 );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( CORRUPT_DB || iStart>=pPage->hdrOffset+6+pPage->childPtrSize );
  assert( CORRUPT_DB || iEnd <= pPage->pBt->usableSize );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( iSize>=4 );   /* Minimum cell size is 4 */
  assert( CORRUPT_DB || iStart<=pPage->pBt->usableSize-4 );

  /* The list of freeblocks must be in ascending order.  Find the
  ** spot on the list where iStart should be inserted.
  */
  hdr = pPage->hdrOffset;
  iPtr = hdr + 1;
  if( data[iPtr+1]==0 && data[iPtr]==0 ){
    iFreeBlk = 0;  /* Shortcut for the case when the freelist is empty */
  }else{
    while( (iFreeBlk = get2byte(&data[iPtr]))<iStart ){
      if( iFreeBlk<=iPtr ){
        if( iFreeBlk==0 ) break; /* TH3: corrupt082.100 */
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iPtr = iFreeBlk;
    }
    if( iFreeBlk>pPage->pBt->usableSize-4 ){ /* TH3: corrupt081.100 */
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( iFreeBlk>iPtr || iFreeBlk==0 || CORRUPT_DB );

    /* At this point:
    **    iFreeBlk:   First freeblock after iStart, or zero if none
    **    iPtr:       The address of a pointer to iFreeBlk
    **
    ** Check to see if iFreeBlk should be coalesced onto the end of iStart.
    */
    if( iFreeBlk && iEnd+3>=iFreeBlk ){
      nFrag = iFreeBlk - iEnd;
      if( iEnd>iFreeBlk ) return SQLITE_CORRUPT_PAGE(pPage);
      iEnd = iFreeBlk + get2byte(&data[iFreeBlk+2]);
      if( iEnd > pPage->pBt->usableSize ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iSize = iEnd - iStart;
      iFreeBlk = get2byte(&data[iFreeBlk]);
    }

    /* If iPtr is another freeblock (that is, if iPtr is not the freelist
    ** pointer in the page header) then check to see if iStart should be
    ** coalesced onto the end of iPtr.
    */
    if( iPtr>hdr+1 ){
      int iPtrEnd = iPtr + get2byte(&data[iPtr+2]);
      if( iPtrEnd+3>=iStart ){
        if( iPtrEnd>iStart ) return SQLITE_CORRUPT_PAGE(pPage);
        nFrag += iStart - iPtrEnd;
        iSize = iEnd - iPtr;
        iStart = iPtr;
      }
    }
    if( nFrag>data[hdr+7] ) return SQLITE_CORRUPT_PAGE(pPage);
    data[hdr+7] -= nFrag;
  }
  pTmp = &data[hdr+5];
  x = get2byte(pTmp);
  if( pPage->pBt->btsFlags & BTS_FAST_SECURE ){
    /* Overwrite deleted information with zeros when the secure_delete
    ** option is enabled */
    memset(&data[iStart], 0, iSize);
  }
  if( iStart<=x ){
    /* The new freeblock is at the beginning of the cell content area,
    ** so just extend the cell content area rather than create another
    ** freelist entry */
    if( iStart<x ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iPtr!=hdr+1 ) return SQLITE_CORRUPT_PAGE(pPage);
    put2byte(&data[hdr+1], iFreeBlk);
    put2byte(&data[hdr+5], iEnd);
  }else{
    /* Insert the new freeblock into the freelist */
    put2byte(&data[iPtr], iStart);
    put2byte(&data[iStart], iFreeBlk);
    put2byte(&data[iStart+2], iSize);
  }
  pPage->nFree += iOrigSize;
  return SQLITE_OK;
}